

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Own<kj::Directory,_std::nullptr_t> __thiscall kj::newDiskDirectory(kj *this,OwnFd *fd)

{
  OwnFd *params;
  Directory *extraout_RDX;
  Own<kj::Directory,_std::nullptr_t> OVar1;
  OwnFd *local_18;
  OwnFd *fd_local;
  
  local_18 = fd;
  fd_local = (OwnFd *)this;
  params = mv<kj::OwnFd>(fd);
  heap<kj::(anonymous_namespace)::DiskDirectory,kj::OwnFd>((kj *)&stack0xffffffffffffffd8,params);
  Own<kj::Directory,decltype(nullptr)>::Own<kj::(anonymous_namespace)::DiskDirectory,void>
            ((Own<kj::Directory,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::DiskDirectory,_std::nullptr_t> *)
             &stack0xffffffffffffffd8);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<Directory> newDiskDirectory(kj::OwnFd fd) {
  return heap<DiskDirectory>(kj::mv(fd));
}